

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  ushort uVar5;
  int iVar6;
  uchar *puVar7;
  int *piVar8;
  int line;
  uint uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  byte bVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  uchar *puVar18;
  uint uVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar24;
  undefined4 uVar26;
  ulong uVar25;
  uint local_40;
  
  uVar12 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4;
  if (ssl->in_msglen < uVar12) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xc06,"handshake message too short: %d");
    return -0x7200;
  }
  pbVar3 = ssl->in_msg;
  uVar12 = ((ulong)pbVar3[3] | (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[1] << 0x10)) + uVar12;
  ssl->in_hslen = uVar12;
  uVar24 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(uint)*pbVar3);
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xc11,"handshake message: msglen = %d, type = %d, hslen = %d",ssl->in_msglen,uVar24,
             uVar12);
  if ((ssl->conf->field_0x174 & 2) == 0) {
    if (ssl->in_msglen < ssl->in_hslen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xc4f,"TLS handshake fragmentation not supported");
      return -0x7080;
    }
    return 0;
  }
  pmVar4 = ssl->handshake;
  puVar7 = ssl->in_msg;
  if (pmVar4 != (mbedtls_ssl_handshake_params *)0x0) {
    uVar5 = *(ushort *)(puVar7 + 4) << 8 | *(ushort *)(puVar7 + 4) >> 8;
    if ((uint)uVar5 != pmVar4->in_msg_seq) {
      uVar26 = (undefined4)((ulong)uVar24 >> 0x20);
      if (((uint)uVar5 != pmVar4->in_flight_start_seq - 1) || (*puVar7 == '\x03')) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xc33,"dropping out-of-sequence message: message_seq = %d, expected = %d",
                   (ulong)uVar5,CONCAT44(uVar26,pmVar4->in_msg_seq),uVar12);
        return -0x6900;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xc26,"received message from last flight, message_seq = %d, start_of_flight = %d",
                 (ulong)uVar5,CONCAT44(uVar26,pmVar4->in_flight_start_seq),uVar12);
      iVar6 = mbedtls_ssl_resend(ssl);
      if (iVar6 == 0) {
        return -0x6900;
      }
      pcVar15 = "mbedtls_ssl_resend";
      line = 0xc2a;
      goto LAB_00112e90;
    }
  }
  if (((ssl->in_hslen <= ssl->in_msglen) && (iVar6 = bcmp(puVar7 + 6,"",3), iVar6 == 0)) &&
     (iVar6 = bcmp(puVar7 + 9,puVar7 + 1,3), iVar6 == 0)) {
    if (pmVar4 == (mbedtls_ssl_handshake_params *)0x0) {
      return 0;
    }
    if (pmVar4->hs_msg == (uchar *)0x0) {
      return 0;
    }
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xc41,"found fragmented DTLS handshake message");
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    pcVar15 = "not supported outside handshake (for now)";
    iVar6 = 0xb75;
LAB_00112cec:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar6,pcVar15);
    iVar6 = -0x7080;
  }
  else {
    sVar17 = ssl->in_hslen;
    uVar1 = sVar17 - 0xc;
    piVar8 = (int *)ssl->handshake->hs_msg;
    if (piVar8 == (int *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb81,"initialize reassembly, total length = %d",uVar1,uVar24,uVar12);
      if (0x4000 < ssl->in_hslen) {
        pcVar15 = "handshake message too large";
        iVar6 = 0xb85;
        goto LAB_00112cec;
      }
      sVar13 = ((uVar1 >> 3) + sVar17 + 1) - (ulong)((uVar1 & 7) == 0);
      puVar7 = (uchar *)calloc(1,sVar13);
      pmVar4 = ssl->handshake;
      pmVar4->hs_msg = puVar7;
      if (puVar7 != (uchar *)0x0) {
        puVar18 = ssl->in_msg;
        *(undefined2 *)(puVar7 + 4) = *(undefined2 *)(puVar18 + 4);
        *(undefined4 *)puVar7 = *(undefined4 *)puVar18;
        puVar7 = pmVar4->hs_msg;
        puVar7[8] = '\0';
        puVar7[6] = '\0';
        puVar7[7] = '\0';
        puVar7 = ssl->handshake->hs_msg;
        puVar7[0xb] = puVar7[3];
        *(undefined2 *)(puVar7 + 9) = *(undefined2 *)(puVar7 + 1);
        piVar10 = (int *)ssl->in_msg;
        piVar8 = (int *)ssl->handshake->hs_msg;
        goto LAB_00112dd5;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb8f,"alloc failed (%d bytes)",sVar13);
      iVar6 = -0x7f00;
    }
    else {
      piVar10 = (int *)ssl->in_msg;
      if (*piVar8 == *piVar10) {
LAB_00112dd5:
        bVar20 = *(byte *)(piVar10 + 2);
        uVar22 = (ulong)((uint)*(byte *)((long)piVar10 + 7) << 8 |
                        (uint)*(byte *)((long)piVar10 + 6) << 0x10) | (ulong)bVar20;
        uVar21 = (uint)*(byte *)((long)piVar10 + 10) << 8 |
                 (uint)*(byte *)((long)piVar10 + 9) << 0x10;
        bVar14 = *(byte *)((long)piVar10 + 0xb);
        sVar13 = (ulong)bVar14 + (ulong)uVar21;
        if (uVar1 < sVar13 + uVar22) {
          pcVar15 = "invalid fragment offset/len: %d + %d > %d";
          iVar6 = 0xbb4;
          uVar25 = sVar13;
          uVar12 = uVar1;
        }
        else {
          uVar2 = sVar13 + 0xc;
          uVar25 = ssl->in_msglen;
          if (uVar2 <= uVar25) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xbc0,"adding fragment, offset = %d, length = %d",uVar22,sVar13,uVar12);
            memcpy((void *)((long)piVar8 + uVar22 + 0xc),ssl->in_msg + 0xc,sVar13);
            bVar20 = bVar20 & 7;
            if (bVar20 == 0) {
LAB_00112fca:
              if ((sVar13 & 7) != 0) {
                uVar12 = uVar22 + sVar13 >> 3;
                bVar20 = *(byte *)((long)piVar8 + uVar12 + sVar17);
                for (iVar6 = 8 - ((uint)sVar13 & 7); iVar6 != 8; iVar6 = iVar6 + 1) {
                  bVar20 = bVar20 | (byte)(1 << ((byte)iVar6 & 0x1f));
                }
                *(byte *)((long)piVar8 + uVar12 + sVar17) = bVar20;
              }
              memset((void *)((long)piVar8 + (uVar22 >> 3) + sVar17),0xff,sVar13 >> 3);
            }
            else {
              bVar20 = 8 - bVar20;
              uVar12 = uVar22 >> 3;
              uVar19 = (uint)sVar13;
              uVar9 = (uint)bVar20;
              if (uVar19 < bVar20 || uVar19 == uVar9) {
                local_40 = (uint)bVar14;
                iVar6 = uVar9 - (uVar21 + local_40);
                sVar16 = sVar13;
                while (bVar23 = sVar16 != 0, sVar16 = sVar16 - 1, sVar13 = 0, bVar23) {
                  pbVar3 = (byte *)((long)piVar8 + uVar12 + sVar17);
                  *pbVar3 = *pbVar3 | (byte)(1 << ((byte)iVar6 & 0x1f));
                  iVar6 = iVar6 + 1;
                }
              }
              else {
                bVar14 = *(byte *)((long)piVar8 + uVar12 + sVar17);
                while (uVar9 = uVar9 - 1, uVar9 != 0xffffffff) {
                  bVar14 = bVar14 | (byte)(1 << ((byte)uVar9 & 0x1f));
                }
                uVar22 = uVar22 + bVar20;
                *(byte *)((long)piVar8 + uVar12 + sVar17) = bVar14;
                sVar13 = sVar13 - bVar20;
              }
              if (bVar20 < uVar19) goto LAB_00112fca;
            }
            uVar12 = 0;
            do {
              if (uVar1 >> 3 == uVar12) {
                lVar11 = 0;
                goto LAB_00113037;
              }
              lVar11 = uVar12 + sVar17;
              uVar12 = uVar12 + 1;
            } while (*(char *)((long)piVar8 + lVar11) == -1);
            goto LAB_00113050;
          }
          pcVar15 = "invalid fragment length: %d + 12 > %d";
          iVar6 = 0xbbb;
          uVar22 = sVar13;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,iVar6,pcVar15,uVar22,uVar25,uVar12);
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb9f,"fragment header mismatch");
      }
      iVar6 = -0x7200;
    }
  }
  goto LAB_00112e77;
  while (iVar6 = (int)lVar11, lVar11 = lVar11 + -1,
        (*(byte *)((long)piVar8 + (uVar1 >> 3) + sVar17) >> (iVar6 + 7U & 0x1f) & 1) != 0) {
LAB_00113037:
    if (-lVar11 == (ulong)((uint)uVar1 & 7)) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xbcf,"handshake message completed");
      if (uVar2 < ssl->in_msglen) {
        pcVar15 = "last fragment not alone in its record";
        iVar6 = 0xbd8;
        goto LAB_00112cec;
      }
      uVar12 = ssl->next_record_offset;
      sVar13 = ssl->in_left - uVar12;
      if (uVar12 <= ssl->in_left && sVar13 != 0) {
        puVar7 = ssl->in_hdr;
        sVar17 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar7;
        ssl->next_record_offset = sVar17;
        puVar18 = (uchar *)(sVar17 + sVar13);
        ssl->in_left = (size_t)puVar18;
        if (ssl->in_buf + (0x414d - (long)puVar7) < puVar18) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0xbee,"reassembled message too large for buffer");
          iVar6 = -0x6a00;
          goto LAB_00112e77;
        }
        memmove(ssl->in_msg + ssl->in_hslen,puVar7 + uVar12,sVar13);
      }
      memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
      free(ssl->handshake->hs_msg);
      ssl->handshake->hs_msg = (uchar *)0x0;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xbfb,"reassembled handshake message",ssl->in_msg,ssl->in_hslen);
      return 0;
    }
  }
LAB_00113050:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xbcb,"message is not complete yet");
  iVar6 = -0x6900;
LAB_00112e77:
  pcVar15 = "ssl_reassemble_dtls_handshake";
  line = 0xc45;
LAB_00112e90:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,line,pcVar15,iVar6);
  return iVar6;
}

Assistant:

int mbedtls_ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        /* ssl->handshake is NULL when receiving ClientHello for renego */
        if( ssl->handshake != NULL &&
            recv_msg_seq != ssl->handshake->in_msg_seq )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    return( 0 );
}